

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.h
# Opt level: O2

float Ptex::v2_2::PtexBicubicFilter::kernelFn(float x,float *c)

{
  float fVar1;
  float fVar2;
  long lStack_8;
  
  fVar1 = ABS(x);
  if (1.0 <= fVar1) {
    if (2.0 <= fVar1) {
      return 0.0;
    }
    fVar2 = (c[3] * fVar1 + c[4]) * fVar1 + c[5];
    lStack_8 = 0x18;
  }
  else {
    fVar2 = (*c * fVar1 + c[1]) * fVar1;
    lStack_8 = 8;
  }
  return fVar2 * fVar1 + *(float *)((long)c + lStack_8);
}

Assistant:

inline float abs(float x)
{
    union {
        float f;
        int32_t i;
    };
    f = x;
    i &= 0x7fffffff;
    return f;
}